

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>
fmt::v8::detail::fill<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t>
          (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> it,size_t n,fill_t<wchar_t> *fill
          )

{
  size_t sVar1;
  wchar_t *pwVar2;
  ulong local_48;
  size_t i;
  wchar_t *data;
  size_t fill_size;
  fill_t<wchar_t> *fill_local;
  size_t n_local;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> it_local;
  
  sVar1 = fill_t<wchar_t>::size(fill);
  if (sVar1 == 1) {
    pwVar2 = fill_t<wchar_t>::operator[](fill,0);
    it_local = fill_n<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_long,wchar_t>
                         (it,n,pwVar2);
  }
  else {
    pwVar2 = fill_t<wchar_t>::data(fill);
    n_local = (size_t)it.container;
    for (local_48 = 0; local_48 < n; local_48 = local_48 + 1) {
      n_local = (size_t)copy_str<wchar_t,wchar_t_const*,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
                                  (pwVar2,pwVar2 + sVar1,
                                   (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)n_local)
      ;
    }
    it_local.container = (buffer<wchar_t> *)n_local;
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)it_local.container;
}

Assistant:

FMT_NOINLINE FMT_CONSTEXPR auto fill(OutputIt it, size_t n,
                                     const fill_t<Char>& fill) -> OutputIt {
  auto fill_size = fill.size();
  if (fill_size == 1) return detail::fill_n(it, n, fill[0]);
  auto data = fill.data();
  for (size_t i = 0; i < n; ++i)
    it = copy_str<Char>(data, data + fill_size, it);
  return it;
}